

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

bool __thiscall duckdb::Node::HasByte(Node *this,ART *art,uint8_t *byte)

{
  Node ptr;
  bool bVar1;
  BaseLeaf<(unsigned_char)__a_,_(duckdb::NType)8> *this_00;
  BaseLeaf<(unsigned_char)__x0f_,_(duckdb::NType)9> *this_01;
  Node256Leaf *this_02;
  InternalException *this_03;
  NType NVar2;
  NType value;
  allocator local_59;
  string local_58;
  string local_38;
  
  ptr = (Node)(this->super_IndexPointer).data;
  value = ptr.super_IndexPointer.data._7_1_ & 0x7f;
  if (value == NODE_256_LEAF) {
    this_02 = Ref<duckdb::Node256Leaf>(art,ptr,NODE_256_LEAF);
    bVar1 = Node256Leaf::HasByte(this_02,byte);
    return bVar1;
  }
  NVar2 = ptr.super_IndexPointer.data._7_1_ & 0x7f;
  if (NVar2 != NODE_15_LEAF) {
    if (NVar2 == NODE_7_LEAF) {
      this_00 = &Ref<duckdb::Node7Leaf_const>(art,ptr,NODE_7_LEAF)->
                 super_BaseLeaf<(unsigned_char)__a_,_(duckdb::NType)8>;
      bVar1 = BaseLeaf<(unsigned_char)'\a',_(duckdb::NType)8>::HasByte(this_00,byte);
      return bVar1;
    }
    this_03 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Invalid node type for GetNextByte: %s.",&local_59);
    EnumUtil::ToString<duckdb::NType>(&local_58,value);
    InternalException::InternalException<std::__cxx11::string>(this_03,&local_38,&local_58);
    __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_01 = &Ref<duckdb::Node15Leaf_const>(art,ptr,NODE_15_LEAF)->
             super_BaseLeaf<(unsigned_char)__x0f_,_(duckdb::NType)9>;
  bVar1 = BaseLeaf<(unsigned_char)'\x0f',_(duckdb::NType)9>::HasByte(this_01,byte);
  return bVar1;
}

Assistant:

bool Node::HasByte(ART &art, uint8_t &byte) const {
	D_ASSERT(HasMetadata());

	auto type = GetType();
	switch (type) {
	case NType::NODE_7_LEAF:
		return Ref<const Node7Leaf>(art, *this, NType::NODE_7_LEAF).HasByte(byte);
	case NType::NODE_15_LEAF:
		return Ref<const Node15Leaf>(art, *this, NType::NODE_15_LEAF).HasByte(byte);
	case NType::NODE_256_LEAF:
		return Ref<Node256Leaf>(art, *this, NType::NODE_256_LEAF).HasByte(byte);
	default:
		throw InternalException("Invalid node type for GetNextByte: %s.", EnumUtil::ToString(type));
	}
}